

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O0

void Emb_ManPrintSolutions(Emb_Man_t *p,int nSols)

{
  float *pfVar1;
  int local_28;
  int local_24;
  int k;
  int i;
  float *pSol;
  int nSols_local;
  Emb_Man_t *p_local;
  
  for (local_24 = 0; local_24 < nSols; local_24 = local_24 + 1) {
    pfVar1 = Emb_ManSol(p,local_24);
    for (local_28 = 0; local_28 < p->nObjs; local_28 = local_28 + 1) {
      printf("%4d ",(ulong)(uint)(int)(pfVar1[local_28] * 100.0));
    }
    printf("\n");
  }
  return;
}

Assistant:

void Emb_ManPrintSolutions( Emb_Man_t * p, int nSols )
{
    float * pSol;
    int i, k;
    for ( i = 0; i < nSols; i++ )
    {
        pSol = Emb_ManSol( p, i );
        for ( k = 0; k < p->nObjs; k++ )
            printf( "%4d ", (int)(100 * pSol[k]) );
        printf( "\n" );
    }
}